

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O2

pair<QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)>_*,_QVariant_(**)(const_void_*,_const_void_*,_double)>
 QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)>::allocate
           (qsizetype capacity,AllocationOption option)

{
  _func_QVariant_void_ptr_void_ptr_double **pp_Var1;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)>_*,_QVariant_(**)(const_void_*,_const_void_*,_double)>
  pVar2;
  QArrayData *d;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  d = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pp_Var1 = (_func_QVariant_void_ptr_void_ptr_double **)
            QArrayData::allocate(&d,8,0x10,capacity,option);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    pVar2.second = pp_Var1;
    pVar2.first = (QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)> *)d;
    return pVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static std::pair<QTypedArrayData *, T *> allocate(qsizetype capacity, AllocationOption option = QArrayData::KeepSize)
    {
        static_assert(sizeof(QTypedArrayData) == sizeof(QArrayData));
        QArrayData *d;
        void *result;
        if constexpr (sizeof(T) == 1) {
            // necessarily, alignof(T) == 1
            result = allocate1(&d, capacity, option);
        } else if constexpr (sizeof(T) == 2) {
            // alignof(T) may be 1, but that makes no difference
            result = allocate2(&d, capacity, option);
        } else {
            result = QArrayData::allocate(&d, sizeof(T), alignof(AlignmentDummy), capacity, option);
        }
#if __has_builtin(__builtin_assume_aligned)
        // and yet we do offer results that have stricter alignment
        result = __builtin_assume_aligned(result, Q_ALIGNOF(AlignmentDummy));
#endif
        return {static_cast<QTypedArrayData *>(d), static_cast<T *>(result)};
    }